

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
          *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  
  resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
            (this,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                   *)other);
  pMVar1 = DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
           lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                     ((DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this,other);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }